

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O3

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  uint uVar2;
  EABase EVar3;
  int iVar4;
  uint8_t local_19;
  
  bVar1 = op->encoding;
  if (6 < bVar1 - 2) {
    if (bVar1 == 1) {
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->reg - (char)insn->regBase,&local_19);
      insn->reg = (uint)bVar1;
    }
    else {
      if (bVar1 != 9) {
        return -1;
      }
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->vvvv,&local_19);
      insn->vvvv = (uint)bVar1;
    }
    if (local_19 != '\0') {
      return 0;
    }
    return -1;
  }
  EVar3 = insn->eaBase;
  uVar2 = EVar3 - insn->eaRegBase;
  if (EVar3 < insn->eaRegBase) {
    return 0;
  }
  switch(op->type) {
  case '4':
    EVar3 = (uVar2 & 7) + EA_REG_MM0;
    break;
  case '5':
  case '6':
  case '7':
  case '8':
    iVar4 = 0x7d;
LAB_0022a760:
    EVar3 = uVar2 + iVar4;
    break;
  case '9':
    EVar3 = uVar2 + EA_REG_YMM0;
    break;
  case ':':
    EVar3 = uVar2 + EA_REG_ZMM0;
    break;
  case ';':
  case '>':
  case '?':
    iVar4 = 0xdd;
    bVar1 = 7;
    goto LAB_0022a869;
  case '<':
  case '=':
  case '@':
  case 'A':
  case 'B':
  case 'F':
switchD_0022a759_caseD_3c:
    insn->eaBase = EA_BASE_NONE;
    return -1;
  case 'C':
    iVar4 = 0xe5;
    bVar1 = 5;
LAB_0022a869:
    insn->eaBase = uVar2 + iVar4 & EA_REG_CR4;
    if ((byte)uVar2 <= bVar1) {
      return 0;
    }
    return -1;
  case 'D':
    EVar3 = uVar2 + EA_REG_DR0;
    break;
  case 'E':
    EVar3 = uVar2 + EA_REG_CR0;
    break;
  case 'G':
    break;
  default:
    switch(op->type) {
    case '\b':
      iVar4 = 0x3d;
      if (insn->rexPrefix == '\0') {
        iVar4 = 0x31;
      }
      if (((byte)uVar2 & 0xfc) != 4) {
        iVar4 = 0x31;
      }
      goto LAB_0022a760;
    case '\t':
      EVar3 = uVar2 + EA_REG_AX;
      break;
    case '\n':
      EVar3 = uVar2 + EA_REG_EAX;
      break;
    case '\v':
      EVar3 = uVar2 + EA_REG_RAX;
      break;
    default:
      goto switchD_0022a759_caseD_3c;
    }
  }
  insn->eaBase = EVar3 & EA_REG_CR4;
  return 0;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}